

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O1

void us_internal_timer_sweep(us_loop_t *loop)

{
  us_socket_context_t *puVar1;
  unsigned_short uVar2;
  us_socket_t *puVar3;
  us_socket_context_t *context;
  
  puVar1 = (loop->data).head;
  (loop->data).iterator = puVar1;
  while (puVar1 != (us_socket_context_t *)0x0) {
    puVar3 = puVar1->head;
    puVar1->iterator = puVar3;
    while (puVar3 != (us_socket_t *)0x0) {
      if (((puVar3->timeout == 0) ||
          (uVar2 = puVar3->timeout - 1, puVar3->timeout = uVar2, uVar2 != 0)) ||
         ((*puVar1->on_socket_timeout)(puVar3), puVar3 == puVar1->iterator)) {
        puVar1->iterator = puVar3->next;
      }
      puVar3 = puVar1->iterator;
    }
    puVar1 = ((loop->data).iterator)->next;
    (loop->data).iterator = puVar1;
  }
  return;
}

Assistant:

void us_internal_timer_sweep(struct us_loop_t *loop) {
    struct us_internal_loop_data_t *loop_data = &loop->data;
    for (loop_data->iterator = loop_data->head; loop_data->iterator; loop_data->iterator = loop_data->iterator->next) {

        struct us_socket_context_t *context = loop_data->iterator;
        for (context->iterator = context->head; context->iterator; ) {

            struct us_socket_t *s = context->iterator;
            if (s->timeout && --(s->timeout) == 0) {

                context->on_socket_timeout(s);

                /* Check for unlink / link */
                if (s == context->iterator) {
                    context->iterator = s->next;
                }
            } else {
                context->iterator = s->next;
            }
        }
    }
}